

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

void __thiscall
toml::detail::region<std::vector<char,_std::allocator<char>_>_>::region
          (region<std::vector<char,_std::allocator<char>_>_> *this,
          region<std::vector<char,_std::allocator<char>_>_> *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  char *pcVar7;
  
  (this->super_region_base)._vptr_region_base = (_func_int **)&PTR__region_0015dac0;
  (this->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (param_2->source_).
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var5 = (param_2->source_).
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (param_2->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar4;
  (this->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  (param_2->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  paVar1 = &(this->source_name_).field_2;
  (this->source_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->source_name_)._M_dataplus._M_p;
  paVar2 = &(param_2->source_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&(param_2->source_name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->source_name_).field_2 + 8) = uVar6;
  }
  else {
    (this->source_name_)._M_dataplus._M_p = pcVar3;
    (this->source_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->source_name_)._M_string_length = (param_2->source_name_)._M_string_length;
  (param_2->source_name_)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->source_name_)._M_string_length = 0;
  (param_2->source_name_).field_2._M_local_buf[0] = '\0';
  pcVar7 = (param_2->last_)._M_current;
  (this->first_)._M_current = (param_2->first_)._M_current;
  (this->last_)._M_current = pcVar7;
  return;
}

Assistant:

region(region&&)      = default;